

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy.c
# Opt level: O3

char * strncpy(char *__dest,char *__src,size_t __n)

{
  char cVar1;
  ulong uVar2;
  
  if (__n != 0) {
    uVar2 = 0;
    do {
      cVar1 = __src[uVar2];
      __dest[uVar2] = cVar1;
      if (cVar1 == '\0') {
        if (__n - uVar2 < 2) {
          return __dest;
        }
        memset(__dest + uVar2 + 1,0,~uVar2 + __n);
        return __dest;
      }
      uVar2 = uVar2 + 1;
    } while (__n != uVar2);
  }
  return __dest;
}

Assistant:

char * strncpy( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    char * rc = s1;

    while ( n && ( *s1++ = *s2++ ) )
    {
        /* Cannot do "n--" in the conditional as size_t is unsigned and we have
           to check it again for >0 in the next loop below, so we must not risk
           underflow.
        */
        --n;
    }

    /* Checking against 1 as we missed the last --n in the loop above. */
    while ( n-- > 1 )
    {
        *s1++ = '\0';
    }

    return rc;
}